

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

QFileSystemEntry *
QFileSystemEngine::absoluteName(QFileSystemEntry *__return_storage_ptr__,QFileSystemEntry *entry)

{
  Data *pDVar1;
  Data *pDVar2;
  qint16 qVar3;
  qsizetype qVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  void *pvVar8;
  int *piVar9;
  char *b;
  long lVar10;
  long in_FS_OFFSET;
  QFileSystemEntry resultingEntry;
  QString local_e0;
  QString local_c8;
  QByteArray local_a8;
  NativePath local_88;
  undefined1 local_68 [56];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = QFileSystemEntry::isEmpty(entry);
  if (bVar7) {
    piVar9 = __errno_location();
    *piVar9 = 0x16;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,entry);
      return __return_storage_ptr__;
    }
    goto LAB_0012f97a;
  }
  QFileSystemEntry::nativeFilePath((NativePath *)local_68,entry);
  uVar6 = local_68._8_8_;
  if (((undefined1 *)local_68._16_8_ == (undefined1 *)0x0) ||
     (pvVar8 = memchr((void *)local_68._8_8_,0,local_68._16_8_), pvVar8 == (void *)0x0)) {
    lVar10 = -1;
  }
  else {
    lVar10 = (long)pvVar8 - uVar6;
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
    }
  }
  if (lVar10 == -1) {
    bVar7 = QFileSystemEntry::isAbsolute(entry);
    if ((bVar7) && (bVar7 = QFileSystemEntry::isClean(entry), bVar7)) {
      pDVar1 = (entry->m_filePath).d.d;
      (__return_storage_ptr__->m_filePath).d.d = pDVar1;
      (__return_storage_ptr__->m_filePath).d.ptr = (entry->m_filePath).d.ptr;
      (__return_storage_ptr__->m_filePath).d.size = (entry->m_filePath).d.size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (entry->m_nativeFilePath).d.d;
      (__return_storage_ptr__->m_nativeFilePath).d.d = pDVar2;
      (__return_storage_ptr__->m_nativeFilePath).d.ptr = (entry->m_nativeFilePath).d.ptr;
      (__return_storage_ptr__->m_nativeFilePath).d.size = (entry->m_nativeFilePath).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      __return_storage_ptr__->m_lastDotInFileName = entry->m_lastDotInFileName;
      qVar3 = entry->m_firstDotInFileName;
      __return_storage_ptr__->m_lastSeparator = entry->m_lastSeparator;
      __return_storage_ptr__->m_firstDotInFileName = qVar3;
    }
    else {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::nativeFilePath(&local_88,entry);
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char *)0x0;
      local_a8.d.size = 0;
      if (((undefined1 *)local_88.d.size == (undefined1 *)0x0) || (*local_88.d.ptr != '/')) {
        local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        currentPath();
        QFileSystemEntry::nativeFilePath((NativePath *)&local_c8,(QFileSystemEntry *)local_68);
        pcVar5 = local_a8.d.ptr;
        pDVar2 = local_a8.d.d;
        qVar4 = local_c8.d.size;
        pDVar1 = local_c8.d.d;
        local_c8.d.d = (Data *)local_a8.d.d;
        local_a8.d.d = (Data *)pDVar1;
        local_a8.d.ptr = (char *)local_c8.d.ptr;
        local_c8.d.ptr = (char16_t *)pcVar5;
        local_c8.d.size = local_a8.d.size;
        local_a8.d.size = qVar4;
        if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar2->super_QArrayData,1,0x10);
          }
        }
        if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
          }
        }
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
      }
      if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
        if ((undefined1 *)local_88.d.size == (undefined1 *)0x1) {
          if ((&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QByteArray::reallocData(&local_88,1,KeepSize);
          }
          if (*local_88.d.ptr == '.') goto LAB_0012f74d;
        }
        if (((undefined1 *)local_a8.d.size != (undefined1 *)0x0) &&
           (*(char *)((long)local_a8.d.ptr + (long)(local_a8.d.size + -1)) != '/')) {
          QByteArray::append(&local_a8,'/');
        }
        QByteArray::append(&local_a8,&local_88);
      }
LAB_0012f74d:
      if ((undefined1 *)local_a8.d.size == (undefined1 *)0x1) {
        if ((&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData(&local_a8,1,KeepSize);
        }
        if (*local_a8.d.ptr != '/') goto LAB_0012f79e;
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,&local_a8);
      }
      else {
LAB_0012f79e:
        if ((undefined1 *)local_a8.d.size == (undefined1 *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = *(char *)((long)local_a8.d.ptr + (long)(local_a8.d.size + -1)) == '/';
        }
        local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68,&local_a8);
        local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QFileSystemEntry::filePath(&local_e0,(QFileSystemEntry *)local_68);
        QDir::cleanPath(&local_c8,&local_e0);
        if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar7) {
          QString::append(&local_c8,(QChar)0x2f);
        }
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,&local_c8);
        if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
          }
        }
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
  }
  else {
    piVar9 = __errno_location();
    *piVar9 = 0x16;
    QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,entry);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0012f97a:
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::absoluteName(const QFileSystemEntry &entry)
{
    Q_CHECK_FILE_NAME(entry, entry);

    if (entry.isAbsolute() && entry.isClean())
        return entry;

    QByteArray orig = entry.nativeFilePath();
    QByteArray result;
    if (orig.isEmpty() || !orig.startsWith('/')) {
        QFileSystemEntry cur(currentPath());
        result = cur.nativeFilePath();
    }
    if (!orig.isEmpty() && !(orig.size() == 1 && orig[0] == '.')) {
        if (!result.isEmpty() && !result.endsWith('/'))
            result.append('/');
        result.append(orig);
    }

    if (result.size() == 1 && result[0] == '/')
        return QFileSystemEntry(result, QFileSystemEntry::FromNativePath());
    const bool isDir = result.endsWith('/');

    /* as long as QDir::cleanPath() operates on a QString we have to convert to a string here.
     * ideally we never convert to a string since that loses information. Please fix after
     * we get a QByteArray version of QDir::cleanPath()
     */
    QFileSystemEntry resultingEntry(result, QFileSystemEntry::FromNativePath());
    QString stringVersion = QDir::cleanPath(resultingEntry.filePath());
    if (isDir)
        stringVersion.append(u'/');
    return QFileSystemEntry(stringVersion);
}